

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_posix.cpp
# Opt level: O2

bool __thiscall
QSystemSemaphorePosix::modifySemaphore
          (QSystemSemaphorePosix *this,QSystemSemaphorePrivate *self,int count)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  QLatin1StringView function;
  QLatin1StringView function_00;
  
  while( true ) {
    bVar1 = handle(this,self,Open);
    if (!bVar1) {
      return false;
    }
    iVar2 = count;
    if (0 < count) break;
    do {
      iVar2 = sem_wait((sem_t *)this->semaphore);
      if (iVar2 != -1) goto LAB_0043c6e2;
      piVar4 = __errno_location();
      iVar2 = *piVar4;
    } while (iVar2 == 4);
    if ((iVar2 != 0x2b) && (iVar2 != 0x16)) {
      function.m_data = "QSystemSemaphore::modifySemaphore (sem_wait)";
      function.m_size = 0x2c;
      QSystemSemaphorePrivate::setUnixErrorString(self,function);
      return false;
    }
    this->semaphore = (sem_t *)0x0;
  }
  do {
    iVar3 = sem_post((sem_t *)this->semaphore);
    if (iVar3 == -1) {
      function_00.m_data = "QSystemSemaphore::modifySemaphore (sem_post)";
      function_00.m_size = 0x2c;
      QSystemSemaphorePrivate::setUnixErrorString(self,function_00);
      do {
        if (count <= iVar2) {
          return false;
        }
        do {
          iVar3 = sem_wait((sem_t *)this->semaphore);
          if (iVar3 != -1) break;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        iVar2 = iVar2 + 1;
      } while( true );
    }
    bVar1 = 1 < iVar2;
    iVar2 = iVar2 + -1;
  } while (bVar1);
LAB_0043c6e2:
  QSystemSemaphorePrivate::clearError(self);
  return true;
}

Assistant:

bool QSystemSemaphorePosix::modifySemaphore(QSystemSemaphorePrivate *self, int count)
{
    if (!handle(self, QSystemSemaphore::Open))
        return false;

    if (count > 0) {
        int cnt = count;
        do {
            if (::sem_post(semaphore) == -1) {
#if defined(Q_OS_VXWORKS)
                if (errno == EINVAL) {
                    semaphore = SEM_FAILED;
                    return modifySemaphore(self, cnt);
                }
#endif
                self->setUnixErrorString("QSystemSemaphore::modifySemaphore (sem_post)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
                qDebug("QSystemSemaphorePosix::modify sem_post failed %d %d", count, errno);
#endif
                // rollback changes to preserve the SysV semaphore behavior
                for ( ; cnt < count; ++cnt) {
                    int res;
                    QT_EINTR_LOOP(res, ::sem_wait(semaphore));
                }
                return false;
            }
            --cnt;
        } while (cnt > 0);
    } else {
        int res;
        QT_EINTR_LOOP(res, ::sem_wait(semaphore));
        if (res == -1) {
            // If the semaphore was removed be nice and create it and then modifySemaphore again
            if (errno == EINVAL || errno == EIDRM) {
                semaphore = SEM_FAILED;
                return modifySemaphore(self, count);
            }
            self->setUnixErrorString("QSystemSemaphore::modifySemaphore (sem_wait)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
            qDebug("QSystemSemaphorePosix::modify sem_wait failed %d %d", count, errno);
#endif
            return false;
        }
    }

    self->clearError();
    return true;
}